

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O0

int agent_sign(LIBSSH2_SESSION *session,uchar **sig,size_t *sig_len,uchar *data,size_t data_len,
              void **abstract)

{
  long lVar1;
  list_head *plVar2;
  int iVar3;
  uint32_t uVar4;
  list_node *plVar5;
  uchar *puVar6;
  size_t sVar7;
  ssize_t plain_len;
  void *pvStack_80;
  uint32_t sign_flags;
  uchar *method_name;
  list_node *plStack_70;
  int rc;
  uchar *s;
  ssize_t method_len;
  ssize_t len;
  agent_publickey *identity;
  agent_transaction_ctx_t transctx;
  LIBSSH2_AGENT *agent;
  void **abstract_local;
  size_t data_len_local;
  uchar *data_local;
  size_t *sig_len_local;
  uchar **sig_local;
  LIBSSH2_SESSION *session_local;
  
  transctx = (agent_transaction_ctx_t)*abstract;
  identity = (agent_publickey *)&transctx->response_len;
  len = transctx[1].response_len;
  method_len = *(long *)(len + 0x30) + data_len + 0xd;
  pvStack_80 = (void *)0x0;
  plain_len._4_4_ = 0;
  agent = (LIBSSH2_AGENT *)abstract;
  abstract_local = (void **)data_len;
  data_len_local = (size_t)data;
  data_local = (uchar *)sig_len;
  sig_len_local = (size_t *)sig;
  sig_local = (uchar **)session;
  if ((int)transctx[1].request_len == 0) {
    plVar5 = (list_node *)(*session->alloc)(method_len,&session->abstract);
    (identity->node).next = plVar5;
    if ((identity->node).next == (list_node *)0x0) {
      plStack_70 = plVar5;
      iVar3 = _libssh2_error((LIBSSH2_SESSION *)sig_local,-6,"out of memory");
      return iVar3;
    }
    plStack_70 = (list_node *)((long)&plVar5->next + 1);
    *(undefined1 *)&plVar5->next = 0xd;
    _libssh2_store_str((uchar **)&stack0xffffffffffffff90,*(char **)(len + 0x28),
                       *(size_t *)(len + 0x30));
    _libssh2_store_str((uchar **)&stack0xffffffffffffff90,(char *)data_len_local,
                       (size_t)abstract_local);
    if ((sig_local[0x234a] != (uchar *)0x0) && (sig_local[0x2349] != (uchar *)0x0)) {
      if ((sig_local[0x234a] == (uchar *)0xc) &&
         (iVar3 = memcmp(sig_local[0x2349],"rsa-sha2-512",0xc), iVar3 == 0)) {
        plain_len._4_4_ = 4;
      }
      else if ((sig_local[0x234a] == (uchar *)0xc) &&
              (iVar3 = memcmp(sig_local[0x2349],"rsa-sha2-256",0xc), iVar3 == 0)) {
        plain_len._4_4_ = 2;
      }
    }
    _libssh2_store_u32((uchar **)&stack0xffffffffffffff90,plain_len._4_4_);
    (identity->node).prev = (list_node *)((long)plStack_70 - (long)(identity->node).next);
    (identity->external).blob = (uchar *)0x0;
    *(undefined4 *)&(identity->external).node = 1;
  }
  if (*(char *)&((identity->node).next)->next == '\r') {
    if (transctx->response == (uchar *)0x0) {
      session_local._4_4_ = _libssh2_error((LIBSSH2_SESSION *)sig_local,-0x27,"agent not connected")
      ;
    }
    else {
      method_name._4_4_ = (**(code **)(transctx->response + 8))(transctx,identity);
      if (method_name._4_4_ == 0) {
        (*(code *)sig_local[3])((identity->node).next,sig_local);
        (identity->node).next = (list_node *)0x0;
        lVar1 = *(long *)&identity->external;
        plVar2 = (identity->node).head;
        method_len = lVar1 + -1;
        plStack_70 = (list_node *)plVar2;
        if (method_len < 0) {
          method_name._4_4_ = -0x2a;
        }
        else if (*(uchar *)&plVar2->last == '\x0e') {
          plStack_70 = (list_node *)((long)&plVar2->last + 1);
          method_len = lVar1 + -5;
          if (method_len < 0) {
            method_name._4_4_ = -0x2a;
          }
          else {
            plStack_70 = (list_node *)((long)&plVar2->last + 5);
            method_len = lVar1 + -9;
            if (method_len < 0) {
              method_name._4_4_ = -0x2a;
            }
            else {
              uVar4 = _libssh2_ntohu32((uchar *)plStack_70);
              s = (uchar *)(ulong)uVar4;
              plStack_70 = (list_node *)((long)&((list_head *)plStack_70)->last + 4);
              method_len = method_len - (long)s;
              if (method_len < 0) {
                method_name._4_4_ = -0x2a;
              }
              else {
                pvStack_80 = (void *)(*(code *)sig_local[1])(s,sig_local);
                if (pvStack_80 == (void *)0x0) {
                  method_name._4_4_ = -6;
                }
                else {
                  memcpy(pvStack_80,plStack_70,(size_t)s);
                  plStack_70 = (list_node *)(s + (long)plStack_70);
                  puVar6 = (uchar *)plain_method((char *)sig_local[0x2349],(size_t)sig_local[0x234a]
                                                );
                  if (((s == sig_local[0x234a]) || (s == puVar6)) &&
                     (iVar3 = memcmp(pvStack_80,sig_local[0x2349],(size_t)s), iVar3 == 0)) {
                    method_len = method_len + -4;
                    if (method_len < 0) {
                      method_name._4_4_ = -0x2a;
                    }
                    else {
                      uVar4 = _libssh2_ntohu32((uchar *)plStack_70);
                      *(ulong *)data_local = (ulong)uVar4;
                      plStack_70 = (list_node *)((long)&((list_head *)plStack_70)->last + 4);
                      method_len = method_len - *(long *)data_local;
                      if (method_len < 0) {
                        method_name._4_4_ = -0x2a;
                      }
                      else {
                        sVar7 = (*(code *)sig_local[1])(*(undefined8 *)data_local,sig_local);
                        *sig_len_local = sVar7;
                        if (*sig_len_local == 0) {
                          method_name._4_4_ = -6;
                        }
                        else {
                          memcpy((void *)*sig_len_local,plStack_70,*(size_t *)data_local);
                        }
                      }
                    }
                  }
                  else {
                    method_name._4_4_ = -0x33;
                  }
                }
              }
            }
          }
        }
        else {
          method_name._4_4_ = -0x2a;
        }
      }
      if (pvStack_80 != (void *)0x0) {
        (*(code *)sig_local[3])(pvStack_80,sig_local);
      }
      (*(code *)sig_local[3])((identity->node).next,sig_local);
      (identity->node).next = (list_node *)0x0;
      (*(code *)sig_local[3])((identity->node).head,sig_local);
      (identity->node).head = (list_head *)0x0;
      *(undefined4 *)&(identity->external).node = 0;
      session_local._4_4_ =
           _libssh2_error((LIBSSH2_SESSION *)sig_local,method_name._4_4_,"agent sign failure");
    }
  }
  else {
    session_local._4_4_ = _libssh2_error((LIBSSH2_SESSION *)sig_local,-0x27,"illegal request");
  }
  return session_local._4_4_;
}

Assistant:

static int
agent_sign(LIBSSH2_SESSION *session, unsigned char **sig, size_t *sig_len,
           const unsigned char *data, size_t data_len, void **abstract)
{
    LIBSSH2_AGENT *agent = (LIBSSH2_AGENT *) (*abstract);
    agent_transaction_ctx_t transctx = &agent->transctx;
    struct agent_publickey *identity = agent->identity;
    ssize_t len = 1 + 4 + identity->external.blob_len + 4 + data_len + 4;
    ssize_t method_len;
    unsigned char *s;
    int rc;
    unsigned char *method_name = NULL;
    uint32_t sign_flags = 0;
    ssize_t plain_len;

    /* Create a request to sign the data */
    if(transctx->state == agent_NB_state_init) {
        s = transctx->request = LIBSSH2_ALLOC(session, len);
        if(!transctx->request)
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "out of memory");

        *s++ = SSH2_AGENTC_SIGN_REQUEST;
        /* key blob */
        _libssh2_store_str(&s, (const char *)identity->external.blob,
                           identity->external.blob_len);
        /* data */
        _libssh2_store_str(&s, (const char *)data, data_len);

        /* flags */
        if(session->userauth_pblc_method_len > 0 &&
            session->userauth_pblc_method) {
            if(session->userauth_pblc_method_len == 12 &&
                !memcmp(session->userauth_pblc_method, "rsa-sha2-512", 12)) {
                sign_flags = SSH_AGENT_RSA_SHA2_512;
            }
            else if(session->userauth_pblc_method_len == 12 &&
                !memcmp(session->userauth_pblc_method, "rsa-sha2-256", 12)) {
                sign_flags = SSH_AGENT_RSA_SHA2_256;
            }
        }
        _libssh2_store_u32(&s, sign_flags);

        transctx->request_len = s - transctx->request;
        transctx->send_recv_total = 0;
        transctx->state = agent_NB_state_request_created;
    }

    /* Make sure to be re-called as a result of EAGAIN. */
    if(*transctx->request != SSH2_AGENTC_SIGN_REQUEST)
        return _libssh2_error(session, LIBSSH2_ERROR_BAD_USE,
                              "illegal request");

    if(!agent->ops)
        /* if no agent has been connected, bail out */
        return _libssh2_error(session, LIBSSH2_ERROR_BAD_USE,
                              "agent not connected");

    rc = agent->ops->transact(agent, transctx);
    if(rc) {
        goto error;
    }
    LIBSSH2_FREE(session, transctx->request);
    transctx->request = NULL;

    len = transctx->response_len;
    s = transctx->response;
    len--;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    if(*s != SSH2_AGENT_SIGN_RESPONSE) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    s++;

    /* Skip the entire length of the signature */
    len -= 4;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    s += 4;

    /* Skip signing method */
    len -= 4;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    method_len = _libssh2_ntohu32(s);
    s += 4;
    len -= method_len;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }

    /* method name */
    method_name = LIBSSH2_ALLOC(session, method_len);
    if(!method_name) {
        rc = LIBSSH2_ERROR_ALLOC;
        goto error;
    }
    memcpy(method_name, s, method_len);
    s += method_len;

    plain_len = plain_method((char *)session->userauth_pblc_method,
                             session->userauth_pblc_method_len);

    /* check to see if we match requested */
    if(((size_t)method_len != session->userauth_pblc_method_len &&
        method_len != plain_len) ||
       memcmp(method_name, session->userauth_pblc_method, method_len)) {
        _libssh2_debug((session,
                       LIBSSH2_TRACE_KEX,
                       "Agent sign method %.*s",
                       (int)method_len, method_name));

        rc = LIBSSH2_ERROR_ALGO_UNSUPPORTED;
        goto error;
    }

    /* Read the signature */
    len -= 4;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    *sig_len = _libssh2_ntohu32(s);
    s += 4;
    len -= *sig_len;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }

    *sig = LIBSSH2_ALLOC(session, *sig_len);
    if(!*sig) {
        rc = LIBSSH2_ERROR_ALLOC;
        goto error;
    }
    memcpy(*sig, s, *sig_len);

error:

    if(method_name)
        LIBSSH2_FREE(session, method_name);

    LIBSSH2_FREE(session, transctx->request);
    transctx->request = NULL;

    LIBSSH2_FREE(session, transctx->response);
    transctx->response = NULL;

    transctx->state = agent_NB_state_init;

    return _libssh2_error(session, rc, "agent sign failure");
}